

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

_Bool target_set_closest(wchar_t mode,monster_predicate pred)

{
  _Bool _Var1;
  int iVar2;
  target_conflict *ptVar3;
  point_set *ps;
  monster *m;
  char m_name [80];
  char acStack_78 [88];
  
  if (target_fixed == '\0') {
    target_set = 0;
    ptVar3 = &target;
    target.grid.y = 0;
    target.midx = 0;
  }
  else {
    ptVar3 = (target_conflict *)&target.midx;
  }
  (ptVar3->grid).x = 0;
  ps = target_get_monsters(mode,pred,false);
  iVar2 = point_set_size((point_set_conflict *)ps);
  if (0 < iVar2) {
    m = square_monster(cave,*ps->pts);
    _Var1 = target_able(m);
    if (_Var1) {
      monster_desc(acStack_78,0x50,m,L'̀');
      if ((mode & 0x10U) == 0) {
        msg("%s is targeted.",acStack_78);
      }
      monster_race_track(player->upkeep,m->race);
      health_track(player->upkeep,m);
      target_set_monster(m);
      _Var1 = true;
      goto LAB_001d2970;
    }
  }
  _Var1 = false;
  msg("No Available Target.");
LAB_001d2970:
  point_set_dispose((point_set_conflict *)ps);
  return _Var1;
}

Assistant:

bool target_set_closest(int mode, monster_predicate pred)
{
	struct monster *mon;
	char m_name[80];
	struct point_set *targets;

	/* Cancel old target */
	target_set_monster(NULL);

	/* Get ready to do targetting */
	targets = target_get_monsters(mode, pred, false);

	/* If nothing was prepared, then return */
	if (point_set_size(targets) < 1) {
		msg("No Available Target.");
		point_set_dispose(targets);
		return false;
	}

	/* Find the first monster in the queue */
	mon = square_monster(cave, targets->pts[0]);
	
	/* Target the monster, if possible */
	if (!target_able(mon)) {
		msg("No Available Target.");
		point_set_dispose(targets);
		return false;
	}

	/* Target the monster */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_CAPITAL | MDESC_COMMA);
	if (!(mode & TARGET_QUIET))
		msg("%s is targeted.", m_name);

	/* Set up target information */
	monster_race_track(player->upkeep, mon->race);
	health_track(player->upkeep, mon);
	target_set_monster(mon);

	point_set_dispose(targets);
	return true;
}